

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

void skill_init(def_skill *class_skill)

{
  char cVar1;
  unsigned_short uVar2;
  int iVar3;
  long lVar4;
  skills *psVar5;
  ulong uVar6;
  objdescr *poVar7;
  char **ppcVar8;
  short *psVar9;
  obj **obj;
  ulong uVar10;
  
  for (lVar4 = 0; lVar4 != 0x2a; lVar4 = lVar4 + 1) {
    psVar5 = u.weapon_skills + lVar4;
    psVar5->skill = '\0';
    psVar5->max_skill = '\0';
    psVar5->advance = 0;
  }
  obj = &invent;
  while (obj = &((obj *)obj)->nobj->nobj, (obj *)obj != (obj *)0x0) {
    iVar3 = weapon_type((obj *)obj);
    if (iVar3 != 0) {
      u.weapon_skills[iVar3].skill = '\x02';
    }
  }
  psVar5 = u.weapon_skills + 0x1f;
  if ((urole.malenum != 0x15e) && (urole.malenum != 0x160)) {
    if (urole.malenum == 0x168) {
      u.weapon_skills[0x1e].skill = '\x02';
      psVar5 = u.weapon_skills + 0x21;
    }
    else {
      if (urole.malenum != 0x161) goto LAB_002711cb;
      psVar5 = u.weapon_skills + 0x22;
    }
  }
  psVar5->skill = '\x02';
LAB_002711cb:
  for (; lVar4 = (long)class_skill->skill, lVar4 != 0; class_skill = class_skill + 1) {
    u.weapon_skills[lVar4].max_skill = class_skill->skmax;
    if (u.weapon_skills[lVar4].skill == '\0') {
      u.weapon_skills[lVar4].skill = '\x01';
    }
  }
  if ('\x04' < u.weapon_skills[0x25].max_skill) {
    u.weapon_skills[0x25].skill = '\x02';
  }
  if (urole.petnum == 0x6b) {
    u.weapon_skills[0x27].skill = '\x02';
  }
  psVar9 = skill_names_indices;
  for (uVar10 = 0; uVar10 != 0x2a; uVar10 = uVar10 + 1) {
    cVar1 = u.weapon_skills[uVar10].skill;
    if (cVar1 != '\0') {
      if (u.weapon_skills[uVar10].max_skill < cVar1) {
        if ((0x2ffd7bfeUL >> (uVar10 & 0x3f) & 1) == 0) {
          if (uVar10 == 0x25) {
            uVar6 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
            ppcVar8 = barehands_or_martial;
          }
          else {
            uVar6 = (ulong)(uint)-(int)*psVar9;
            ppcVar8 = odd_skill_names;
          }
          poVar7 = (objdescr *)(ppcVar8 + uVar6);
        }
        else {
          poVar7 = obj_descr + objects[*psVar9].oc_name_idx;
        }
        impossible("skill_init: curr > max: %s",poVar7->oc_name);
        cVar1 = u.weapon_skills[uVar10].skill;
        u.weapon_skills[uVar10].max_skill = cVar1;
      }
      uVar2 = (cVar1 + -1) * (cVar1 + -1) * 0x14;
      if (6 < (int)uVar10 - 0x1eU) {
        uVar2 = (unsigned_short)(100 << (cVar1 - 2U & 0x1f));
      }
      u.weapon_skills[uVar10].advance = uVar2;
    }
    psVar9 = psVar9 + 1;
  }
  return;
}

Assistant:

void skill_init(const struct def_skill *class_skill)
{
	struct obj *obj;
	int skmax, skill;

	/* initialize skill array; by default, everything is restricted */
	for (skill = 0; skill < P_NUM_SKILLS; skill++) {
	    P_SKILL(skill) = P_ISRESTRICTED;
	    P_MAX_SKILL(skill) = P_ISRESTRICTED;
	    P_ADVANCE(skill) = 0;
	}

	/* Set skill for all weapons in inventory to be basic */
	for (obj = invent; obj; obj = obj->nobj) {
	    skill = weapon_type(obj);
	    if (skill != P_NONE)
		P_SKILL(skill) = P_BASIC;
	}

	/* set skills for magic */
	if (Role_if (PM_HEALER) || Role_if(PM_MONK)) {
		P_SKILL(P_HEALING_SPELL) = P_BASIC;
	} else if (Role_if (PM_PRIEST)) {
		P_SKILL(P_CLERIC_SPELL) = P_BASIC;
	} else if (Role_if (PM_WIZARD)) {
		P_SKILL(P_ATTACK_SPELL) = P_BASIC;
		P_SKILL(P_ENCHANTMENT_SPELL) = P_BASIC;
	}

	/* walk through array to set skill maximums */
	for (; class_skill->skill != P_NONE; class_skill++) {
	    skmax = class_skill->skmax;
	    skill = class_skill->skill;

	    P_MAX_SKILL(skill) = skmax;
	    if (P_SKILL(skill) == P_ISRESTRICTED)	/* skill pre-set */
		P_SKILL(skill) = P_UNSKILLED;
	}

	/* High potential fighters already know how to use their hands. */
	if (P_MAX_SKILL(P_BARE_HANDED_COMBAT) > P_EXPERT)
	    P_SKILL(P_BARE_HANDED_COMBAT) = P_BASIC;

	/* Roles that start with a horse know how to ride it */
	if (urole.petnum == PM_PONY)
	    P_SKILL(P_RIDING) = P_BASIC;

	/*
	 * Make sure we haven't missed setting the max on a skill
	 * & set advance
	 */
	for (skill = 0; skill < P_NUM_SKILLS; skill++) {
	    if (!P_RESTRICTED(skill)) {
		if (P_MAX_SKILL(skill) < P_SKILL(skill)) {
		    impossible("skill_init: curr > max: %s", P_NAME(skill));
		    P_MAX_SKILL(skill) = P_SKILL(skill);
		}
		P_ADVANCE(skill) = practice_needed_to_advance(skill, P_SKILL(skill) - 1);
	    }
	}
}